

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

int floatx80_is_quiet_nan_x86_64(floatx80 a,float_status *status)

{
  return (int)(a.low._7_1_ >> 6 & 1 & (~a._8_4_ & 0x7fff) == 0);
}

Assistant:

int floatx80_is_quiet_nan(floatx80 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return floatx80_is_any_nan(a);
#else
    if (snan_bit_is_one(status)) {
        uint64_t aLow;

        aLow = a.low & ~0x4000000000000000ULL;
        return ((a.high & 0x7FFF) == 0x7FFF)
            && (aLow << 1)
            && (a.low == aLow);
    } else {
        return ((a.high & 0x7FFF) == 0x7FFF)
            && (UINT64_C(0x8000000000000000) <= ((uint64_t)(a.low << 1)));
    }
#endif
}